

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

opj_bool jp2_get_tile(opj_jp2_v2_t *jp2,opj_stream_private_t *p_stream,opj_image_t *p_image,
                     opj_event_mgr *p_manager,OPJ_UINT32 tile_index)

{
  opj_jp2_color_t *color;
  opj_jp2_pclr_t *poVar1;
  opj_bool oVar2;
  OPJ_COLOR_SPACE OVar3;
  opj_bool oVar4;
  
  if (p_image == (opj_image_t *)0x0) {
    oVar4 = 0;
  }
  else {
    oVar4 = 0;
    opj_event_msg_v2(p_manager,2,
                     "JP2 box which are after the codestream will not be read by this function.\n");
    oVar2 = j2k_get_tile(jp2->j2k,p_stream,p_image,p_manager,tile_index);
    if (oVar2 == 0) {
      opj_event_msg_v2(p_manager,1,"Failed to decode the codestream in the JP2 file\n");
    }
    else {
      OVar3 = CLRSPC_UNKNOWN;
      if (jp2->enumcs - 0x10 < 3) {
        OVar3 = jp2->enumcs + 0xfffffff1;
      }
      p_image->color_space = OVar3;
      color = &jp2->color;
      if ((jp2->color).jp2_cdef != (opj_jp2_cdef_t *)0x0) {
        jp2_apply_cdef(p_image,color);
      }
      poVar1 = (jp2->color).jp2_pclr;
      if (poVar1 != (opj_jp2_pclr_t *)0x0) {
        if (poVar1->cmap == (opj_jp2_cmap_comp_t *)0x0) {
          jp2_free_pclr(color);
        }
        else {
          jp2_apply_pclr(p_image,color);
        }
      }
      oVar4 = 1;
      if (color->icc_profile_buf != (OPJ_BYTE *)0x0) {
        p_image->icc_profile_buf = color->icc_profile_buf;
        p_image->icc_profile_len = (jp2->color).icc_profile_len;
        (jp2->color).icc_profile_buf = (uchar *)0x0;
      }
    }
  }
  return oVar4;
}

Assistant:

opj_bool jp2_get_tile(	opj_jp2_v2_t *jp2,
						opj_stream_private_t *p_stream,
						opj_image_t* p_image,
						struct opj_event_mgr * p_manager,
						OPJ_UINT32 tile_index )
{
	if (!p_image)
		return OPJ_FALSE;

	opj_event_msg_v2(p_manager, EVT_WARNING, "JP2 box which are after the codestream will not be read by this function.\n");

	if (! j2k_get_tile(jp2->j2k, p_stream, p_image, p_manager, tile_index) ){
		opj_event_msg_v2(p_manager, EVT_ERROR, "Failed to decode the codestream in the JP2 file\n");
		return OPJ_FALSE;
	}

	/* Set Image Color Space */
	if (jp2->enumcs == 16)
		p_image->color_space = CLRSPC_SRGB;
	else if (jp2->enumcs == 17)
		p_image->color_space = CLRSPC_GRAY;
	else if (jp2->enumcs == 18)
		p_image->color_space = CLRSPC_SYCC;
	else
		p_image->color_space = CLRSPC_UNKNOWN;

	/* Apply the color space if needed */
	if(jp2->color.jp2_cdef) {
		jp2_apply_cdef(p_image, &(jp2->color));
	}

	if(jp2->color.jp2_pclr) {
		/* Part 1, I.5.3.4: Either both or none : */
		if( !jp2->color.jp2_pclr->cmap)
			jp2_free_pclr(&(jp2->color));
		else
			jp2_apply_pclr(p_image, &(jp2->color));
	}

	if(jp2->color.icc_profile_buf) {
		p_image->icc_profile_buf = jp2->color.icc_profile_buf;
		p_image->icc_profile_len = jp2->color.icc_profile_len;
		jp2->color.icc_profile_buf = NULL;
	}

	return OPJ_TRUE;
}